

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

string * __thiscall
cmsys::SystemInformationImplementation::ParseValueFromKStat_abi_cxx11_
          (string *__return_storage_ptr__,SystemInformationImplementation *this,char *arguments)

{
  pointer pbVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var5;
  SystemInformationImplementation *this_00;
  char cVar6;
  size_t i;
  long lVar7;
  long lVar8;
  string buffer;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_string;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_68;
  string command;
  
  args_string.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  args_string.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  args_string.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&command,arguments,(allocator<char> *)&buffer);
  cVar6 = (char)&command;
  uVar2 = std::__cxx11::string::find(cVar6,0x20);
  while (uVar2 != 0xffffffffffffffff) {
    do {
      uVar3 = std::__cxx11::string::find(cVar6,0x22);
      uVar4 = std::__cxx11::string::find(cVar6,0x22);
      if ((uVar4 <= uVar3) || (uVar4 == 0xffffffffffffffff)) {
        std::__cxx11::string::substr((ulong)&buffer,(ulong)&command);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_string
                   ,&buffer);
        std::__cxx11::string::~string((string *)&buffer);
        pbVar1 = args_string.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        _Var5._M_current =
             args_string.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
        buffer._M_dataplus._M_p._0_1_ = 0x22;
        _Var5 = std::
                __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          (_Var5,_Var5._M_current +
                                 args_string.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish[-1]._M_string_length,
                           (_Iter_equals_val<const_char>)&buffer);
        std::__cxx11::string::erase
                  (pbVar1 + -1,_Var5._M_current,
                   pbVar1[-1]._M_dataplus._M_p + pbVar1[-1]._M_string_length);
        break;
      }
    } while (uVar2 <= uVar3 || uVar4 <= uVar2);
    uVar2 = std::__cxx11::string::find(cVar6,0x20);
  }
  std::__cxx11::string::substr((ulong)&buffer,(ulong)&command);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&args_string,
             &buffer);
  std::__cxx11::string::~string((string *)&buffer);
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::reserve
            (&args,((long)args_string.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)args_string.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5) + 3);
  buffer._M_dataplus._M_p = "kstat";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&args,(char **)&buffer);
  buffer._M_dataplus._M_p = "-p";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&args,(char **)&buffer);
  lVar8 = 0;
  for (uVar2 = 0;
      uVar2 < (ulong)((long)args_string.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)args_string.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5); uVar2 = uVar2 + 1) {
    buffer._M_dataplus._M_p =
         *(pointer *)
          ((long)&((args_string.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar8);
    std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
              ((vector<char_const*,std::allocator<char_const*>> *)&args,(char **)&buffer);
    lVar8 = lVar8 + 0x20;
  }
  buffer._M_dataplus._M_p = (pointer)0x0;
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&args,(char **)&buffer);
  this_00 = (SystemInformationImplementation *)&args;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_68,
             (vector<const_char_*,_std::allocator<const_char_*>_> *)this_00);
  RunProcess_abi_cxx11_
            (&buffer,this_00,(vector<const_char_*,_std::allocator<const_char_*>_> *)&local_68);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_68);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar8 = buffer._M_string_length - 1;
  while (lVar7 = lVar8 + -1, lVar8 != 0) {
    cVar6 = buffer._M_dataplus._M_p[lVar8];
    lVar8 = lVar7;
    if ((cVar6 != '\n') && (cVar6 != '\r')) {
      if ((cVar6 == '\t') || (cVar6 == ' ')) break;
      std::__cxx11::string::insert((ulong)__return_storage_ptr__,0,'\x01');
    }
  }
  std::__cxx11::string::~string((string *)&buffer);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&args.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::__cxx11::string::~string((string *)&command);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args_string);
  return __return_storage_ptr__;
}

Assistant:

std::string SystemInformationImplementation::ParseValueFromKStat(
  const char* arguments)
{
  std::vector<std::string> args_string;
  std::string command = arguments;
  size_t start = std::string::npos;
  size_t pos = command.find(' ', 0);
  while (pos != std::string::npos) {
    bool inQuotes = false;
    // Check if we are between quotes
    size_t b0 = command.find('"', 0);
    size_t b1 = command.find('"', b0 + 1);
    while (b0 != std::string::npos && b1 != std::string::npos && b1 > b0) {
      if (pos > b0 && pos < b1) {
        inQuotes = true;
        break;
      }
      b0 = command.find('"', b1 + 1);
      b1 = command.find('"', b0 + 1);
    }

    if (!inQuotes) {
      args_string.push_back(command.substr(start + 1, pos - start - 1));
      std::string& arg = args_string.back();

      // Remove the quotes if any
      arg.erase(std::remove(arg.begin(), arg.end(), '"'), arg.end());
      start = pos;
    }
    pos = command.find(' ', pos + 1);
  }
  args_string.push_back(command.substr(start + 1, command.size() - start - 1));

  std::vector<const char*> args;
  args.reserve(3 + args_string.size());
  args.push_back("kstat");
  args.push_back("-p");
  for (size_t i = 0; i < args_string.size(); ++i) {
    args.push_back(args_string[i].c_str());
  }
  args.push_back(KWSYS_NULLPTR);

  std::string buffer = this->RunProcess(args);

  std::string value;
  for (size_t i = buffer.size() - 1; i > 0; i--) {
    if (buffer[i] == ' ' || buffer[i] == '\t') {
      break;
    }
    if (buffer[i] != '\n' && buffer[i] != '\r') {
      value.insert(0u, 1, buffer[i]);
    }
  }
  return value;
}